

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.h
# Opt level: O0

void __thiscall SQFuncState::AddDefaultParam(SQFuncState *this,SQInteger trg)

{
  sqvector<long_long> *in_RSI;
  longlong *in_stack_ffffffffffffffe8;
  
  sqvector<long_long>::push_back(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void AddDefaultParam(SQInteger trg) { _defaultparams.push_back(trg); }